

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afcjk.c
# Opt level: O3

FT_Error af_cjk_metrics_init(AF_CJKMetrics metrics,FT_Face face)

{
  ushort uVar1;
  AF_Blue_Stringset AVar2;
  uint uVar3;
  FT_CharMap pFVar4;
  FT_GlyphSlot pFVar5;
  FT_Vector *pFVar6;
  int iVar7;
  char cVar8;
  FT_Error FVar9;
  AF_Blue_String AVar10;
  FT_Pos *pFVar11;
  AF_Blue_StringRec *pAVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  byte bVar16;
  AF_CJKMetrics pAVar17;
  undefined7 uVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  FT_Vector *pFVar27;
  char *pcVar28;
  bool bVar29;
  FT_ULong shaper_buf_;
  FT_Pos flats [51];
  FT_Pos fills [51];
  uint local_3c4;
  ulong local_3c0;
  ulong local_3b8;
  AF_CJKMetrics local_3b0;
  AF_CJKMetrics local_3a8;
  AF_CJKMetrics local_3a0;
  FT_Face local_398;
  FT_Pos *local_390;
  FT_CharMap local_388;
  AF_CJKMetrics local_380;
  AF_CJKMetrics local_378;
  AF_Blue_StringRec *local_370;
  long alStack_368 [52];
  long alStack_1c8 [51];
  char *p;
  
  pFVar4 = face->charmap;
  metrics->units_per_em = (uint)face->units_per_EM;
  FVar9 = FT_Select_Charmap(face,FT_ENCODING_UNICODE);
  local_388 = pFVar4;
  if (FVar9 == 0) {
    pAVar17 = (AF_CJKMetrics)face;
    af_cjk_metrics_init_widths(metrics,face);
    AVar2 = ((metrics->root).style_class)->blue_stringset;
    AVar10 = af_blue_stringsets[AVar2].string;
    if (AVar10 != AF_BLUE_STRING_MAX) {
      pAVar12 = af_blue_stringsets + AVar2;
      local_378 = (AF_CJKMetrics)metrics->axis;
      local_380 = (AF_CJKMetrics)(metrics->axis + 1);
      local_3a0 = metrics;
      local_398 = face;
      do {
        uVar1 = pAVar12->properties;
        local_3a8 = local_378;
        if ((uVar1 & 2) == 0) {
          local_3a8 = local_380;
        }
        cVar8 = af_blue_strings[AVar10];
        local_370 = pAVar12;
        if (cVar8 != '\0') {
          bVar29 = true;
          local_3b8 = 0;
          local_3c0 = 0;
          p = af_blue_strings + AVar10;
          do {
            while( true ) {
              pcVar28 = p + 1;
              if (cVar8 != ' ') break;
              cVar8 = *pcVar28;
              p = pcVar28;
            }
            if (cVar8 == '|') {
              bVar29 = false;
            }
            else {
              pAVar17 = metrics;
              pcVar28 = af_shaper_get_cluster(p,&metrics->root,&local_3b0,&local_3c4);
              if ((((local_3c4 < 2) && (pAVar17 = local_3b0, local_3b0 != (AF_CJKMetrics)0x0)) &&
                  (FVar9 = FT_Load_Glyph(face,(FT_UInt)local_3b0,1), FVar9 == 0)) &&
                 (pFVar5 = face->glyph, 2 < (pFVar5->outline).n_points)) {
                lVar14 = (long)(pFVar5->outline).n_contours;
                if (lVar14 < 1) {
                  lVar24 = 0;
                }
                else {
                  pFVar6 = (pFVar5->outline).points;
                  local_390 = &pFVar6->y;
                  iVar15 = -1;
                  lVar19 = 0;
                  iVar21 = 0;
                  lVar24 = 0;
                  pAVar17 = (AF_CJKMetrics)local_390;
                  do {
                    iVar20 = (int)(pFVar5->outline).contours[lVar19];
                    if (iVar21 < iVar20) {
                      lVar26 = (long)iVar21;
                      lVar25 = (iVar20 - lVar26) + 1;
                      if ((uVar1 & 2) == 0) {
                        if ((uVar1 & 1) == 0) {
                          pFVar11 = local_390 + lVar26 * 2;
                          do {
                            pAVar17 = (AF_CJKMetrics)
                                      CONCAT71((int7)((ulong)pAVar17 >> 8),iVar15 < 0);
                            lVar26 = *pFVar11;
                            iVar7 = iVar21;
                            if (lVar24 <= *pFVar11 && iVar15 >= 0) {
                              lVar26 = lVar24;
                              iVar7 = iVar15;
                            }
                            iVar15 = iVar7;
                            lVar24 = lVar26;
                            iVar21 = iVar21 + 1;
                            pFVar11 = pFVar11 + 2;
                            lVar25 = lVar25 + -1;
                          } while (lVar25 != 0);
                        }
                        else {
                          pFVar11 = local_390 + lVar26 * 2;
                          do {
                            pAVar17 = (AF_CJKMetrics)
                                      CONCAT71((int7)((ulong)pAVar17 >> 8),iVar15 < 0);
                            lVar26 = *pFVar11;
                            iVar7 = iVar21;
                            if (*pFVar11 <= lVar24 && iVar15 >= 0) {
                              lVar26 = lVar24;
                              iVar7 = iVar15;
                            }
                            iVar15 = iVar7;
                            lVar24 = lVar26;
                            iVar21 = iVar21 + 1;
                            pFVar11 = pFVar11 + 2;
                            lVar25 = lVar25 + -1;
                          } while (lVar25 != 0);
                        }
                      }
                      else {
                        pFVar27 = pFVar6 + lVar26;
                        if ((uVar1 & 1) == 0) {
                          do {
                            pAVar17 = (AF_CJKMetrics)
                                      CONCAT71((int7)((ulong)pAVar17 >> 8),iVar15 < 0);
                            lVar26 = pFVar27->x;
                            iVar7 = iVar21;
                            if (lVar24 <= pFVar27->x && iVar15 >= 0) {
                              lVar26 = lVar24;
                              iVar7 = iVar15;
                            }
                            iVar15 = iVar7;
                            lVar24 = lVar26;
                            iVar21 = iVar21 + 1;
                            pFVar27 = pFVar27 + 1;
                            lVar25 = lVar25 + -1;
                          } while (lVar25 != 0);
                        }
                        else {
                          do {
                            lVar26 = pFVar27->x;
                            pAVar17 = (AF_CJKMetrics)
                                      CONCAT71((int7)((ulong)pAVar17 >> 8),
                                               lVar24 < lVar26 || iVar15 < 0);
                            iVar7 = iVar21;
                            if (lVar24 >= lVar26 && iVar15 >= 0) {
                              lVar26 = lVar24;
                              iVar7 = iVar15;
                            }
                            iVar15 = iVar7;
                            lVar24 = lVar26;
                            iVar21 = iVar21 + 1;
                            pFVar27 = pFVar27 + 1;
                            lVar25 = lVar25 + -1;
                          } while (lVar25 != 0);
                        }
                      }
                    }
                    iVar21 = iVar20 + 1;
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != lVar14);
                }
                face = local_398;
                metrics = local_3a0;
                if (bVar29) {
                  uVar13 = local_3b8 & 0xffffffff;
                  local_3b8 = (ulong)((int)local_3b8 + 1);
                  alStack_1c8[uVar13] = lVar24;
                }
                else {
                  uVar13 = local_3c0 & 0xffffffff;
                  local_3c0 = (ulong)((int)local_3c0 + 1);
                  alStack_368[uVar13] = lVar24;
                  bVar29 = false;
                }
              }
            }
            cVar8 = *pcVar28;
            p = pcVar28;
          } while (cVar8 != '\0');
          uVar22 = (uint)local_3c0;
          uVar23 = (uint)local_3b8;
          if (uVar22 != 0 || uVar23 != 0) {
            if (1 < uVar23) {
              uVar13 = 1;
              lVar14 = 0;
              do {
                lVar24 = alStack_1c8[uVar13];
                lVar19 = lVar14;
                do {
                  if (alStack_1c8[lVar19] <= lVar24) break;
                  alStack_1c8[lVar19 + 1] = alStack_1c8[lVar19];
                  alStack_1c8[lVar19] = lVar24;
                  bVar29 = lVar19 != 0;
                  lVar19 = lVar19 + -1;
                } while (bVar29);
                uVar13 = uVar13 + 1;
                lVar14 = lVar14 + 1;
              } while (uVar13 != (local_3b8 & 0xffffffff));
            }
            pAVar17 = local_3a8;
            if (uVar22 < 2) {
              uVar3 = *(uint *)((long)((FT_BBox *)local_3a8->axis[0].widths + 10) + 4);
              pFVar11 = &local_3a8->axis[0].blues[(ulong)uVar3 - 2].shoot.cur;
              *(uint *)((long)((FT_BBox *)local_3a8->axis[0].widths + 10) + 4) = uVar3 + 1;
              if (uVar22 != 0) goto LAB_00265003;
              lVar14 = alStack_1c8[uVar23 >> 1];
LAB_0026505b:
              pFVar11[3] = lVar14;
              *pFVar11 = lVar14;
            }
            else {
              uVar13 = 1;
              lVar14 = 0;
              do {
                lVar24 = alStack_368[uVar13];
                lVar19 = lVar14;
                do {
                  if (alStack_368[lVar19] <= lVar24) break;
                  alStack_368[lVar19 + 1] = alStack_368[lVar19];
                  alStack_368[lVar19] = lVar24;
                  bVar29 = lVar19 != 0;
                  lVar19 = lVar19 + -1;
                } while (bVar29);
                uVar13 = uVar13 + 1;
                lVar14 = lVar14 + 1;
              } while (uVar13 != (local_3c0 & 0xffffffff));
              uVar3 = *(uint *)((long)((FT_BBox *)local_3a8->axis[0].widths + 10) + 4);
              pFVar11 = &local_3a8->axis[0].blues[(ulong)uVar3 - 2].shoot.cur;
              *(uint *)((long)((FT_BBox *)local_3a8->axis[0].widths + 10) + 4) = uVar3 + 1;
LAB_00265003:
              if (uVar23 == 0) {
                lVar14 = alStack_368[uVar22 >> 1];
                goto LAB_0026505b;
              }
              lVar14 = alStack_1c8[uVar23 >> 1];
              *pFVar11 = lVar14;
              lVar24 = alStack_368[uVar22 >> 1];
              pFVar11[3] = lVar24;
              uVar18 = (undefined7)((ulong)local_3a8 >> 8);
              pAVar17 = (AF_CJKMetrics)CONCAT71(uVar18,lVar14 <= lVar24);
              if ((lVar24 != lVar14) &&
                 (bVar16 = lVar14 <= lVar24 ^ (byte)uVar1,
                 pAVar17 = (AF_CJKMetrics)CONCAT71(uVar18,bVar16), (bVar16 & 1) == 0)) {
                lVar14 = (lVar24 + lVar14) / 2;
                goto LAB_0026505b;
              }
            }
            *(uint *)(pFVar11 + 6) = (uint)uVar1 * 2 & 2;
          }
        }
        AVar10 = local_370[1].string;
        pAVar12 = local_370 + 1;
      } while (AVar10 != AF_BLUE_STRING_MAX);
    }
    af_cjk_metrics_check_digits(metrics,(FT_Face)pAVar17);
  }
  face->charmap = local_388;
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_cjk_metrics_init( AF_CJKMetrics  metrics,
                       FT_Face        face )
  {
    FT_CharMap  oldmap = face->charmap;


    metrics->units_per_em = face->units_per_EM;

    if ( !FT_Select_Charmap( face, FT_ENCODING_UNICODE ) )
    {
      af_cjk_metrics_init_widths( metrics, face );
      af_cjk_metrics_init_blues( metrics, face );
      af_cjk_metrics_check_digits( metrics, face );
    }

    face->charmap = oldmap;
    return FT_Err_Ok;
  }